

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O2

void rcg::storePointCloud
               (string *name,double f,double t,double scale,shared_ptr<const_rcg::Image> *left,
               shared_ptr<const_rcg::Image> *disp,shared_ptr<const_rcg::Image> *conf,
               shared_ptr<const_rcg::Image> *error)

{
  long lVar1;
  ushort uVar2;
  element_type *peVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  uint64_t uVar7;
  pointer puVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  _Head_base<0UL,_unsigned_char_*,_false> _Var15;
  size_t i_2;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ushort uVar19;
  int jj;
  long lVar20;
  ushort uVar21;
  int iVar22;
  _Head_base<0UL,_unsigned_char_*,_false> _Var23;
  uchar *puVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  size_t i_1;
  uchar *puVar28;
  bool bVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  pointer local_360;
  _Head_base<0UL,_unsigned_char_*,_false> local_348;
  _Head_base<0UL,_unsigned_char_*,_false> local_340;
  uint16_t v_1 [4];
  uint8_t rgb [3];
  long local_2d0;
  long local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vindex;
  ofstream out;
  
  peVar3 = (disp->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var23._M_head_impl =
       *(uchar **)
        &(peVar3->pixel)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
  uVar4 = peVar3->width;
  uVar5 = peVar3->height;
  bVar29 = peVar3->bigendian;
  uVar11 = (ulong)bVar29;
  sVar6 = ((left->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->width;
  auVar31._8_4_ = (int)(uVar4 >> 0x20);
  auVar31._0_8_ = uVar4;
  auVar31._12_4_ = 0x45300000;
  dVar35 = (auVar31._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
  lVar12 = uVar4 * 2 + peVar3->xpadding;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vindex,uVar5 * uVar4,(allocator_type *)&out);
  uVar27 = 0;
  puVar8 = vindex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
    for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
      puVar8[uVar16] = 0xffffffff;
      if (*(char *)((long)_Var23._M_head_impl + uVar16 * 2 + 1) != '\0' ||
          *(char *)((long)_Var23._M_head_impl + uVar16 * 2) != '\0') {
        puVar8[uVar16] = uVar27;
        uVar27 = uVar27 + 1;
      }
    }
    _Var23._M_head_impl = _Var23._M_head_impl + lVar12;
    puVar8 = puVar8 + uVar4;
  }
  iVar22 = 0;
  _Var23._M_head_impl =
       *(uchar **)
        &(((disp->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->pixel).
         _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
  dVar30 = ceil(2.0 / scale);
  uVar16 = (ulong)(bVar29 ^ 1);
  _Var15._M_head_impl = _Var23._M_head_impl;
  for (uVar14 = 1; uVar14 < uVar5; uVar14 = uVar14 + 1) {
    for (uVar17 = 1; uVar17 < uVar4; uVar17 = uVar17 + 1) {
      _out = CONCAT11(*(undefined1 *)((long)_Var15._M_head_impl + uVar17 * 2 + -2 + uVar16),
                      *(undefined1 *)((long)_Var15._M_head_impl + uVar11 + uVar17 * 2 + -2));
      uVar19 = 0xffff;
      uVar21 = 0;
      iVar18 = 0;
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        uVar2 = *(ushort *)(&out + lVar20 * 2);
        if (uVar2 != 0) {
          if (uVar2 < uVar19) {
            uVar19 = uVar2;
          }
          if (uVar21 <= uVar2) {
            uVar21 = uVar2;
          }
          iVar18 = iVar18 + 1;
        }
      }
      if ((2 < iVar18) && ((int)((uint)uVar21 - (uint)uVar19) <= (int)((int)dVar30 & 0xffffU))) {
        iVar22 = iVar22 + iVar18 + -2;
      }
    }
    _Var15._M_head_impl = lVar12 + _Var15._M_head_impl;
  }
  peVar3 = (conf->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    local_340._M_head_impl = (uchar *)0x0;
    local_2c8 = 0;
  }
  else {
    local_340._M_head_impl =
         *(uchar **)
          &(peVar3->pixel)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
    local_2c8 = peVar3->xpadding + peVar3->width;
  }
  peVar3 = (error->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    local_348._M_head_impl = (uchar *)0x0;
    local_2d0 = 0;
  }
  else {
    local_348._M_head_impl =
         *(uchar **)
          &(peVar3->pixel)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
    local_2d0 = peVar3->xpadding + peVar3->width;
  }
  if (name->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
    uVar7 = ((left->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            timestamp;
    poVar9 = std::operator<<((ostream *)&out,"rc_visard_");
    auVar38._8_4_ = (int)(uVar7 >> 0x20);
    auVar38._0_8_ = uVar7;
    auVar38._12_4_ = 0x45300000;
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 8) = 0x10;
    poVar9 = std::ostream::_M_insert<double>
                       (((auVar38._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
                        1000000000.0);
    std::operator<<(poVar9,".ply");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)name,(string *)rgb);
    std::__cxx11::string::~string((string *)rgb);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  }
  std::ofstream::ofstream(&out,(string *)name,_S_out);
  poVar9 = std::operator<<((ostream *)&out,"ply");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"format ascii 1.0");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,
                           "comment Created with gc_pointcloud from Roboception GmbH");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"element vertex ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"property float32 x");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"property float32 y");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"property float32 z");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"property float32 scan_size");
  std::endl<char,std::char_traits<char>>(poVar9);
  if (local_340._M_head_impl != (uchar *)0x0) {
    poVar9 = std::operator<<((ostream *)&out,"property float32 scan_conf");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  if (local_348._M_head_impl != (uchar *)0x0) {
    poVar9 = std::operator<<((ostream *)&out,"property float32 scan_error");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  poVar9 = std::operator<<((ostream *)&out,"property uint8 diffuse_red");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"property uint8 diffuse_green");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"property uint8 diffuse_blue");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"element face ");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar22);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"property list uint8 uint32 vertex_indices");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&out,"end_header");
  std::endl<char,std::char_traits<char>>(poVar9);
  dVar36 = f * dVar35;
  auVar32._0_8_ = (double)CONCAT44(0x43300000,(int)uVar5);
  auVar32._8_4_ = (int)(uVar5 >> 0x20);
  auVar32._12_4_ = 0x45300000;
  puVar28 = _Var23._M_head_impl + uVar16;
  puVar24 = _Var23._M_head_impl + uVar11;
  dVar35 = dVar35 * -0.5;
  for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
    auVar33._8_4_ = (int)(uVar14 >> 0x20);
    auVar33._0_8_ = uVar14;
    auVar33._12_4_ = 0x45300000;
    for (uVar17 = 0; uVar4 != uVar17; uVar17 = uVar17 + 1) {
      dVar37 = (double)CONCAT11(puVar28[uVar17 * 2],puVar24[uVar17 * 2]) * scale;
      if ((dVar37 != 0.0) || (NAN(dVar37))) {
        auVar34._8_4_ = (int)(uVar17 >> 0x20);
        auVar34._0_8_ = uVar17;
        auVar34._12_4_ = 0x45300000;
        dVar39 = (auVar34._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(uint32_t)uVar17) - 4503599627370496.0);
        dVar40 = ((dVar39 + 0.5 + dVar35) * t) / dVar37;
        getColor(rgb,left,(uint32_t)(((uVar4 - 1) + sVar6) / uVar4),(uint32_t)uVar17,
                 (uint32_t)uVar14);
        poVar9 = std::ostream::_M_insert<double>(dVar40);
        std::operator<<(poVar9," ");
        poVar9 = std::ostream::_M_insert<double>
                           ((((auVar33._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(uint32_t)uVar14) - 4503599627370496.0) +
                              0.5 + ((auVar32._8_8_ - 1.9342813113834067e+25) +
                                    (auVar32._0_8_ - 4503599627370496.0)) * -0.5) * t) / dVar37);
        std::operator<<(poVar9," ");
        poVar9 = std::ostream::_M_insert<double>((dVar36 * t) / dVar37);
        std::operator<<(poVar9," ");
        poVar9 = std::ostream::_M_insert<double>
                           (ABS(((dVar35 + dVar39) * t) / dVar37 - dVar40) * 2.8);
        std::operator<<(poVar9," ");
        if (local_340._M_head_impl != (uchar *)0x0) {
          poVar9 = std::ostream::_M_insert<double>((double)local_340._M_head_impl[uVar17] / 255.0);
          std::operator<<(poVar9," ");
        }
        if (local_348._M_head_impl != (uchar *)0x0) {
          poVar9 = std::ostream::_M_insert<double>
                             (((double)local_348._M_head_impl[uVar17] * scale * dVar36 * t) /
                              (dVar37 * dVar37));
          std::operator<<(poVar9," ");
        }
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&out,_rgb & 0xff);
        std::operator<<(poVar9," ");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&out,_rgb >> 8 & 0xff);
        std::operator<<(poVar9," ");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&out,_rgb >> 0x10 & 0xff);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
    }
    local_340._M_head_impl = local_340._M_head_impl + local_2c8;
    local_348._M_head_impl = local_348._M_head_impl + local_2d0;
    puVar28 = puVar28 + lVar12;
    puVar24 = puVar24 + lVar12;
  }
  local_360 = vindex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  _Var23._M_head_impl =
       *(uchar **)
        &(((disp->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->pixel).
         _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
  for (uVar14 = 1; uVar14 < uVar5; uVar14 = uVar14 + 1) {
    _Var15._M_head_impl = lVar12 + _Var23._M_head_impl;
    for (uVar17 = 1; uVar17 < uVar4; uVar17 = uVar17 + 1) {
      lVar10 = uVar11 + uVar17 * 2 + -2;
      lVar13 = uVar16 + uVar17 * 2 + -2;
      v_1[0] = CONCAT11(*(undefined1 *)((long)_Var23._M_head_impl + lVar13),
                        *(undefined1 *)((long)_Var23._M_head_impl + lVar10));
      lVar20 = uVar11 + uVar17 * 2;
      lVar1 = uVar16 + uVar17 * 2;
      v_1[1] = CONCAT11(*(undefined1 *)((long)_Var23._M_head_impl + lVar1),
                        *(undefined1 *)((long)_Var23._M_head_impl + lVar20));
      v_1[2] = CONCAT11(_Var15._M_head_impl[lVar13],_Var15._M_head_impl[lVar10]);
      v_1[3] = CONCAT11(_Var15._M_head_impl[lVar1],_Var15._M_head_impl[lVar20]);
      uVar19 = 0xffff;
      uVar21 = 0;
      iVar22 = 0;
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        uVar2 = v_1[lVar20];
        if (uVar2 != 0) {
          if (uVar2 < uVar19) {
            uVar19 = uVar2;
          }
          if (uVar21 <= uVar2) {
            uVar21 = uVar2;
          }
          iVar22 = iVar22 + 1;
        }
      }
      if ((2 < iVar22) && ((int)((uint)uVar21 - (uint)uVar19) <= (int)((int)dVar30 & 0xffffU))) {
        bVar29 = local_360[uVar17 - 1] != 0xffffffff;
        if (bVar29) {
          _rgb = local_360[uVar17 - 1];
        }
        uVar25 = (ulong)bVar29;
        if (local_360[uVar4 + uVar17 + -1] != 0xffffffff) {
          uVar25 = (ulong)(bVar29 + 1);
          *(uint *)(rgb + (ulong)bVar29 * 4) = local_360[uVar4 + uVar17 + -1];
        }
        uVar26 = uVar25;
        if (local_360[uVar4 + uVar17] != 0xffffffff) {
          uVar26 = (ulong)((int)uVar25 + 1);
          *(uint *)(rgb + uVar25 * 4) = local_360[uVar4 + uVar17];
        }
        iVar22 = (int)uVar26;
        if (local_360[uVar17] != 0xffffffff) {
          iVar22 = iVar22 + 1;
          *(uint *)(rgb + uVar26 * 4) = local_360[uVar17];
        }
        poVar9 = std::operator<<((ostream *)&out,"3 ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,' ');
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,' ');
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
        if (iVar22 == 4) {
          poVar9 = std::operator<<((ostream *)&out,"3 ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,' ');
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,' ');
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
      }
    }
    local_360 = local_360 + uVar4;
    _Var23._M_head_impl = _Var15._M_head_impl;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vindex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void storePointCloud(std::string name, double f, double t, double scale,
                     std::shared_ptr<const Image> left,
                     std::shared_ptr<const Image> disp,
                     std::shared_ptr<const Image> conf,
                     std::shared_ptr<const Image> error)
{
  // get size and scale factor between left image and disparity image

  size_t width=disp->getWidth();
  size_t height=disp->getHeight();
  bool bigendian=disp->isBigEndian();
  size_t ds=(left->getWidth()+disp->getWidth()-1)/disp->getWidth();

  // convert focal length factor into focal length in (disparity) pixels

  f*=width;

  // get pointer to disparity data and size of row in bytes

  const uint8_t *dps=disp->getPixels();
  size_t dstep=disp->getWidth()*sizeof(uint16_t)+disp->getXPadding();

  // count number of valid disparities and store vertice index in a temporary
  // index image

  size_t vi=0;
  const uint32_t vinvalid=0xffffffff;
  std::vector<uint32_t> vindex(width*height);

  uint32_t n=0;
  for (size_t k=0; k<height; k++)
  {
    int j=0;
    for (size_t i=0; i<width; i++)
    {
      vindex[vi]=vinvalid;
      if ((dps[j]|dps[j+1]) != 0) vindex[vi]=n++;

      j+=2;
      vi++;
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // count number of triangles

  const uint16_t vstep=static_cast<uint16_t>(std::ceil(2/scale));

  int tn=0;
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        tn+=valid-2;
      }
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // get pointer to optional confidence and error data and size of row in bytes

  const uint8_t *cps=0, *eps=0;
  size_t cstep=0, estep=0;

  if (conf)
  {
    cps=conf->getPixels();
    cstep=conf->getWidth()*sizeof(uint8_t)+conf->getXPadding();
  }

  if (error)
  {
    eps=error->getPixels();
    estep=error->getWidth()*sizeof(uint8_t)+error->getXPadding();
  }

  // open output file and write ASCII PLY header

  if (name.size() == 0)
  {
    std::ostringstream os;
    double timestamp=left->getTimestampNS()/1000000000.0;
    os << "rc_visard_" << std::setprecision(16) << timestamp << ".ply";
    name=os.str();
  }

  std::ofstream out(name);

  out << "ply" << std::endl;
  out << "format ascii 1.0" << std::endl;
  out << "comment Created with gc_pointcloud from Roboception GmbH" << std::endl;
  out << "comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]" << std::endl;
  out << "element vertex " << n << std::endl;
  out << "property float32 x" << std::endl;
  out << "property float32 y" << std::endl;
  out << "property float32 z" << std::endl;
  out << "property float32 scan_size" << std::endl; // i.e. size of 3D point

  if (cps != 0)
  {
    out << "property float32 scan_conf" << std::endl; // optional confidence
  }

  if (eps != 0)
  {
    out << "property float32 scan_error" << std::endl; // optional error in 3D along line of sight
  }

  out << "property uint8 diffuse_red" << std::endl;
  out << "property uint8 diffuse_green" << std::endl;
  out << "property uint8 diffuse_blue" << std::endl;
  out << "element face " << tn << std::endl;
  out << "property list uint8 uint32 vertex_indices" << std::endl;
  out << "end_header" << std::endl;

  // create colored point cloud

  for (size_t k=0; k<height; k++)
  {
    for (size_t i=0; i<width; i++)
    {
      // convert disparity from fixed comma 16 bit integer into float value

      double d=scale*getUint16(dps, bigendian, i);

      // if disparity is valid and color can be obtained

      if (d)
      {
        // reconstruct 3D point from disparity value

        double x=(i+0.5-0.5*width)*t/d;
        double y=(k+0.5-0.5*height)*t/d;
        double z=f*t/d;

        // compute size of reconstructed point

        double x2=(i-0.5*width)*t/d;
        double size=2*1.4*std::abs(x2-x);

        // get corresponding color value

        uint8_t rgb[3];
        getColor(rgb, left, static_cast<uint32_t>(ds), static_cast<uint32_t>(i),
                 static_cast<uint32_t>(k));

        // store colored point, optionally with confidence and error

        out << x << " " << y << " " << z << " " << size << " ";

        if (cps != 0)
        {
          out << cps[i]/255.0 << " ";
        }

        if (eps != 0)
        {
          out << eps[i]*scale*f*t/(d*d) << " ";
        }

        out << static_cast<int>(rgb[0]) << " ";
        out << static_cast<int>(rgb[1]) << " ";
        out << static_cast<int>(rgb[2]) << std::endl;
      }
    }

    dps+=dstep;
    cps+=cstep;
    eps+=estep;
  }

  dps=disp->getPixels();

  // create triangles

  uint32_t *ips=vindex.data();
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        int j=0;
        uint32_t fc[4];

        if (ips[i-1] != vinvalid)
        {
          fc[j++]=ips[i-1];
        }

        if (ips[width+i-1] != vinvalid)
        {
          fc[j++]=ips[width+i-1];
        }

        if (ips[width+i] != vinvalid)
        {
          fc[j++]=ips[width+i];
        }

        if (ips[i] != vinvalid)
        {
          fc[j++]=ips[i];
        }

        out << "3 " << fc[0] << ' ' << fc[1] << ' ' << fc[2] << std::endl;

        if (j == 4)
        {
          out << "3 " << fc[2] << ' ' << fc[3] << ' ' << fc[0] << std::endl;
        }
      }
    }

    ips+=width;
    dps+=dstep;
  }

  out.close();
}